

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Storyboard.cpp
# Opt level: O0

ostream * ApprovalTests::operator<<(ostream *os,Storyboard *board)

{
  ostream *in_RDI;
  string local_30 [40];
  ostream *local_8;
  
  local_8 = in_RDI;
  ::std::__cxx11::stringstream::str();
  ::std::operator<<(in_RDI,local_30);
  ::std::__cxx11::string::~string(local_30);
  return local_8;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Storyboard& board)
    {
        os << board.output_.str();
        return os;
    }